

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_spawn.h
# Opt level: O1

void __thiscall
sc_core::sc_spawn_object<sc_core::sc_clock_posedge_callback>::semantics
          (sc_spawn_object<sc_core::sc_clock_posedge_callback> *this)

{
  sc_event *psVar1;
  pointer *pppsVar2;
  sc_clock *psVar3;
  sc_simcontext *psVar4;
  iterator __position;
  value_type vVar5;
  value_type vVar6;
  sc_prim_channel_registry *psVar7;
  notify_t nVar8;
  sc_event_timed *elem;
  value_type local_20;
  
  psVar3 = (this->m_object).m_target_p;
  psVar1 = &psVar3->m_next_negedge_event;
  if ((psVar3->m_negedge_time).m_value == SC_ZERO_TIME) {
    psVar4 = (psVar3->m_next_negedge_event).m_simc;
    __position._M_current =
         (psVar4->m_delta_events).
         super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (psVar4->m_delta_events).
        super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_20 = psVar1;
      std::vector<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>::_M_realloc_insert
                (&psVar4->m_delta_events,__position,&local_20);
    }
    else {
      *__position._M_current = psVar1;
      pppsVar2 = &(psVar4->m_delta_events).
                  super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppsVar2 = *pppsVar2 + 1;
    }
    (psVar3->m_next_negedge_event).m_delta_event_index =
         (int)((ulong)((long)(psVar4->m_delta_events).
                             super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(psVar4->m_delta_events).
                            super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    nVar8 = DELTA;
  }
  else {
    elem = (sc_event_timed *)sc_event_timed::allocate();
    vVar5 = (psVar3->m_negedge_time).m_value;
    psVar4 = (psVar3->m_next_negedge_event).m_simc;
    vVar6 = (psVar4->m_curr_time).m_value;
    elem->m_event = psVar1;
    (elem->m_notify_time).m_value = vVar5 + vVar6;
    sc_ppq_base::insert(&psVar4->m_timed_events->super_sc_ppq_base,elem);
    (psVar3->m_next_negedge_event).m_timed = elem;
    nVar8 = TIMED;
  }
  (psVar3->m_next_negedge_event).m_notify_type = nVar8;
  (psVar3->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
  super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.m_new_val = true;
  if ((psVar3->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
      super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
      super_sc_prim_channel.m_update_next_p == (sc_prim_channel *)0x0) {
    psVar7 = (psVar3->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
             super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
             super_sc_prim_channel.m_registry;
    (psVar3->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
    super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
    super_sc_prim_channel.m_update_next_p = psVar7->m_update_list_p;
    psVar7->m_update_list_p =
         &(psVar3->super_sc_signal<bool,_(sc_core::sc_writer_policy)0>).
          super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>.super_sc_signal_channel.
          super_sc_prim_channel;
  }
  return;
}

Assistant:

inline sc_process_handle sc_spawn( 
    typename T::result_type* r_p, 
    T object, 
    const char* name_p = 0,
    const sc_spawn_options* opt_p = 0)
{
    sc_simcontext*      context_p;
    sc_spawn_object_v<T>* spawn_p;
    
    context_p = sc_get_curr_simcontext();
    
    spawn_p = new sc_spawn_object_v<T>(r_p, object);
    if ( !opt_p || !opt_p->is_method() )
    {
            sc_process_handle thread_handle = context_p->create_thread_process( 
            name_p, true,
            SC_MAKE_FUNC_PTR(sc_spawn_object_v<T>,semantics), 
            spawn_p, opt_p 
        );
        return thread_handle;
    }
    else
    {
            sc_process_handle method_handle = context_p->create_method_process( 
            name_p, true,
            SC_MAKE_FUNC_PTR(sc_spawn_object_v<T>,semantics), 
            spawn_p, opt_p 
        );
        return method_handle;
    }
}